

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_iforprep(function *fn,int A,int pc,int step_one,int pc1)

{
  int pc1_local;
  int step_one_local;
  int pc_local;
  int A_local;
  function *fn_local;
  
  if (fn->locals[A] == '\0') {
    fn->locals[A] = '\x01';
    membuff_add_fstring(&fn->prologue,"lua_Integer i_%d = 0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Integer limit_%d = 0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Integer step_%d = 0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Number ninit_%d = 0.0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Number nlimit_%d = 0.0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"lua_Number nstep_%d = 0.0;\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->prologue,"int intloop_%d = 0;\n",(ulong)(uint)A);
  }
  emit_reg(fn,"ra",A);
  membuff_add_fstring(&fn->body,"i_%d = ivalue(ra);\n",(ulong)(uint)A);
  membuff_add_fstring(&fn->body,"ra = R(%d);\n",(ulong)(A + 1));
  membuff_add_fstring(&fn->body,"limit_%d = ivalue(ra);\n",(ulong)(uint)A);
  if (step_one == 0) {
    membuff_add_fstring(&fn->body,"ra = R(%d);\n",(ulong)(A + 2));
    membuff_add_fstring(&fn->body,"step_%d = ivalue(ra);\n",(ulong)(uint)A);
    membuff_add_fstring(&fn->body,"i_%d -= step_%d;\n",(ulong)(uint)A,(ulong)(uint)A);
  }
  else {
    membuff_add_fstring(&fn->body,"i_%d -= 1;\n",(ulong)(uint)A);
  }
  membuff_add_fstring(&fn->body,"goto Lbc_%d;\n",(ulong)(uint)pc);
  return;
}

Assistant:

static void emit_op_iforprep(struct function *fn, int A, int pc, int step_one, int pc1) {
  (void)pc1;
  if (!fn->locals[A]) {
    fn->locals[A] = 1;  // Lua can reuse the same forloop vars if loop isn't nested
    // Although in IFOR instructions we do not need all the vars below
    // it can happen that the same slot is used by normal FOR loop
    // The optimizer should get rid of unused vars anyway
    membuff_add_fstring(&fn->prologue, "lua_Integer i_%d = 0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Integer limit_%d = 0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Integer step_%d = 0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Number ninit_%d = 0.0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Number nlimit_%d = 0.0;\n", A);
    membuff_add_fstring(&fn->prologue, "lua_Number nstep_%d = 0.0;\n", A);
    membuff_add_fstring(&fn->prologue, "int intloop_%d = 0;\n", A);
  }
  emit_reg(fn, "ra", A);
  membuff_add_fstring(&fn->body, "i_%d = ivalue(ra);\n", A);
  membuff_add_fstring(&fn->body, "ra = R(%d);\n", A + 1);
  membuff_add_fstring(&fn->body, "limit_%d = ivalue(ra);\n", A);
  if (!step_one) {
    membuff_add_fstring(&fn->body, "ra = R(%d);\n", A + 2);
    membuff_add_fstring(&fn->body, "step_%d = ivalue(ra);\n", A);
    membuff_add_fstring(&fn->body, "i_%d -= step_%d;\n", A, A);
  }
  else {
    membuff_add_fstring(&fn->body, "i_%d -= 1;\n", A);
  }
  membuff_add_fstring(&fn->body, "goto Lbc_%d;\n", pc);
}